

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O0

int __thiscall primesieve::SievingPrimes::init(SievingPrimes *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  uint64_t uVar1;
  EVP_PKEY_CTX *ctx_00;
  PreSieve *in_RDX;
  
  uVar1 = PreSieve::getMaxPrime(in_RDX);
  ctx_00 = (EVP_PKEY_CTX *)(uVar1 + 1);
  Erat::getStop((Erat *)ctx);
  anon_unknown.dwarf_125e9a::isqrt<unsigned_long>((unsigned_long)ctx_00);
  Erat::getSieveSize((Erat *)ctx);
  Erat::init(&this->super_Erat,ctx_00);
  tinySieve((SievingPrimes *)ctx);
  return extraout_EAX;
}

Assistant:

void SievingPrimes::init(Erat* erat, PreSieve& preSieve)
{
  Erat::init(preSieve.getMaxPrime() + 1,
             isqrt(erat->getStop()),
             erat->getSieveSize(),
             preSieve);

  tinySieve();
}